

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte bVar1;
  stbi_uc sVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 *in_RCX;
  int *in_RDX;
  int *in_RSI;
  stbi__context *in_RDI;
  stbi__pic_packet *packet;
  stbi__pic_packet packets [10];
  int chained;
  int num_packets;
  int act_comp;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  stbi__context *in_stack_ffffffffffffffa0;
  stbi_uc *psVar5;
  stbi_uc local_58 [36];
  uint local_34;
  int local_30;
  uint local_2c;
  undefined4 *local_28;
  int *local_20;
  int *local_18;
  stbi__context *local_10;
  int local_4;
  
  local_2c = 0;
  local_30 = 0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  stbi__skip(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  iVar3 = stbi__get16be(in_stack_ffffffffffffffa0);
  *local_18 = iVar3;
  iVar3 = stbi__get16be(in_stack_ffffffffffffffa0);
  *local_20 = iVar3;
  iVar3 = stbi__at_eof((stbi__context *)
                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (iVar3 == 0) {
    if ((*local_18 == 0) || (*local_20 <= (int)(0x10000000 / (long)*local_18))) {
      stbi__skip(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      do {
        if (local_30 == 10) {
          return 0;
        }
        psVar5 = local_58 + (long)local_30 * 3;
        local_30 = local_30 + 1;
        bVar1 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        local_34 = (uint)bVar1;
        sVar2 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        *psVar5 = sVar2;
        sVar2 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        psVar5[1] = sVar2;
        sVar2 = stbi__get8((stbi__context *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        psVar5[2] = sVar2;
        local_2c = psVar5[2] | local_2c;
        iVar3 = stbi__at_eof((stbi__context *)
                             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (iVar3 != 0) {
          stbi__rewind(local_10);
          return 0;
        }
        if (*psVar5 != '\b') {
          stbi__rewind(local_10);
          return 0;
        }
      } while (local_34 != 0);
      uVar4 = 3;
      if ((local_2c & 0x10) != 0) {
        uVar4 = 4;
      }
      *local_28 = uVar4;
      local_4 = 1;
    }
    else {
      stbi__rewind(local_10);
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained;
   stbi__pic_packet packets[10];

   stbi__skip(s, 92);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s))  return 0;
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
       stbi__rewind( s );
       return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}